

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

int sign_picnic3(uint8_t *privateKey,uint8_t *pubKey,uint8_t *plaintext,uint8_t *message,
                size_t messageByteLength,signature2_t *sig,picnic_instance_t *params)

{
  uint16_t *list;
  long lVar1;
  size_t __size;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  lowmc_simulate_online_f p_Var5;
  uint16_t *__ptr;
  uint8_t *puVar6;
  void *pvVar7;
  size_t sVar8;
  long lVar9;
  proof2_t *in_RDX;
  picnic_instance_t *in_RSI;
  uint8_t *in_RDI;
  picnic_instance_t *in_R8;
  picnic_instance_t *in_R9;
  picnic_instance_t *in_stack_00000008;
  size_t t_4;
  size_t last_1;
  uint16_t hideList [1];
  size_t P_index;
  size_t t_3;
  proof2_t *proofs;
  uint8_t *cvInfo;
  size_t cvInfoLen;
  uint16_t *missingLeaves;
  size_t missingLeavesSize;
  uint16_t *challengeP;
  uint16_t *challengeC;
  tree_t treeCv;
  size_t t_2;
  picnic_instance_t *in_stack_000000d8;
  int rv;
  mzd_local_t m_maskedKey [1];
  size_t i;
  uint8_t *maskedKey;
  uint8_t **in_stack_00000110;
  uint16_t t_1;
  size_t last;
  uint8_t *seed_ptr [4];
  size_t j;
  size_t t;
  lowmc_simulate_online_f simulateOnline;
  mzd_local_t m_plaintext [1];
  commitments_t Cv;
  commitments_t Ch;
  msgs_t *msgs;
  inputs_t inputs;
  commitments_t *C;
  tree_t *seeds;
  randomTape_t *tapes;
  uint8_t *iSeeds;
  int ret;
  tree_t iSeedsTree;
  picnic_instance_t *params_00;
  picnic_instance_t *ppVar10;
  proof2_t *proof;
  tree_t *in_stack_fffffffffffffdb0;
  commitments_t *in_stack_fffffffffffffdb8;
  picnic_instance_t *params_01;
  tree_t *in_stack_fffffffffffffdc0;
  tree_t *in_stack_fffffffffffffdc8;
  uint8_t *in_stack_fffffffffffffdd0;
  mzd_local_t *in_stack_fffffffffffffdd8;
  uint16_t *missingLeaves_00;
  tree_t *in_stack_fffffffffffffde0;
  picnic_instance_t *in_stack_fffffffffffffdf0;
  ulong uVar11;
  uint8_t *in_stack_fffffffffffffdf8;
  undefined6 in_stack_fffffffffffffe00;
  undefined2 in_stack_fffffffffffffe06;
  uint8_t *in_stack_fffffffffffffe08;
  uint8_t *in_stack_fffffffffffffe10;
  tree_t *in_stack_fffffffffffffe18;
  long lVar12;
  signature2_t *in_stack_fffffffffffffe28;
  undefined8 uVar13;
  picnic_instance_t *in_stack_fffffffffffffe30;
  uint16_t *local_190;
  uint8_t *in_stack_fffffffffffffe80;
  picnic_instance_t *in_stack_fffffffffffffe88;
  commitments_t *in_stack_fffffffffffffe90;
  msgs_t *in_stack_fffffffffffffe98;
  uint16_t *in_stack_fffffffffffffea0;
  uint8_t *in_stack_fffffffffffffea8;
  ushort local_14a;
  picnic_instance_t *in_stack_fffffffffffffeb8;
  uint8_t *in_stack_fffffffffffffec0;
  uint8_t *in_stack_fffffffffffffec8;
  uint8_t *in_stack_fffffffffffffed0;
  picnic_instance_t *in_stack_fffffffffffffed8;
  ulong local_118;
  ulong local_110;
  mzd_local_t local_100 [2];
  msgs_t *local_b0;
  inputs_t local_a8;
  commitments_t *local_a0;
  void *local_98;
  void *local_90;
  uint8_t *local_88;
  int local_7c;
  tree_t local_78;
  picnic_instance_t *local_58;
  picnic_instance_t *local_50;
  proof2_t *local_40;
  picnic_instance_t *local_38;
  uint8_t *local_30;
  int local_24;
  
  ppVar10 = in_stack_00000008;
  local_58 = in_R9;
  local_50 = in_R8;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  _Var2 = initialize_seeds_tree
                    (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                     (uint8_t *)CONCAT26(in_stack_fffffffffffffe06,in_stack_fffffffffffffe00),
                     in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0,
                     in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
  if (_Var2) {
    local_7c = -1;
    local_88 = getLeaves(&local_78);
    if (local_88 != (uint8_t *)0x0) {
      local_90 = calloc((ulong)in_stack_00000008->num_rounds,0x98);
      local_98 = calloc((ulong)in_stack_00000008->num_rounds,0x20);
      local_a0 = allocateCommitments((picnic_instance_t *)in_stack_fffffffffffffdc8,
                                     (size_t)in_stack_fffffffffffffdc0);
      local_a8 = allocateInputs((picnic_instance_t *)in_stack_fffffffffffffdb8);
      local_b0 = allocateMsgs((picnic_instance_t *)in_stack_fffffffffffffdc0);
      if ((((local_90 != (void *)0x0) && (local_98 != (void *)0x0)) &&
          (local_a0 != (commitments_t *)0x0)) &&
         ((local_a8 != (inputs_t)0x0 && (local_b0 != (msgs_t *)0x0)))) {
        allocateCommitments2
                  (in_stack_fffffffffffffdb8,(picnic_instance_t *)in_stack_fffffffffffffdb0,
                   (size_t)ppVar10);
        allocateCommitments2
                  (in_stack_fffffffffffffdb8,(picnic_instance_t *)in_stack_fffffffffffffdb0,
                   (size_t)ppVar10);
        memset(local_100,0,0x20);
        mzd_from_char_array(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                            (size_t)in_stack_fffffffffffffdc8);
        p_Var5 = lowmc_simulate_online_get_implementation
                           ((lowmc_parameters_t *)in_stack_fffffffffffffdb0);
        for (local_110 = 0; local_110 < in_stack_00000008->num_rounds; local_110 = local_110 + 1) {
          _Var2 = generateSeeds(in_stack_fffffffffffffdc0,
                                (uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                                (uint8_t *)in_stack_fffffffffffffdb0,(uint8_t *)ppVar10,
                                (size_t)in_R9,(picnic_instance_t *)0x13da45);
          if (!_Var2) goto LAB_0013e626;
          getLeaves((tree_t *)((long)local_98 + local_110 * 0x20));
          createRandomTapes((randomTape_t *)maskedKey,(uint8_t *)i,(uint8_t *)m_maskedKey[0].w64[3],
                            m_maskedKey[0].w64[2],(picnic_instance_t *)m_maskedKey[0].w64[1]);
          computeAuxTape((randomTape_t *)
                         CONCAT26(in_stack_fffffffffffffe06,in_stack_fffffffffffffe00),
                         in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
          for (local_118 = 0; local_118 < in_stack_00000008->num_MPC_parties;
              local_118 = local_118 + 4) {
            uVar3 = (uint)local_118;
            in_stack_fffffffffffffec0 = getLeaf((tree_t *)((long)local_98 + local_110 * 0x20),uVar3)
            ;
            in_stack_fffffffffffffec8 =
                 getLeaf((tree_t *)((long)local_98 + local_110 * 0x20),uVar3 + 1);
            in_stack_fffffffffffffed0 =
                 getLeaf((tree_t *)((long)local_98 + local_110 * 0x20),uVar3 + 2);
            in_stack_fffffffffffffed8 =
                 (picnic_instance_t *)
                 getLeaf((tree_t *)((long)local_98 + local_110 * 0x20),uVar3 + 3);
            commit_x4((uint8_t **)maskedKey,(uint8_t **)i,(uint8_t *)m_maskedKey[0].w64[3],
                      m_maskedKey[0].w64[2],m_maskedKey[0].w64[1],
                      (picnic_instance_t *)m_maskedKey[0].w64[0]);
          }
          uVar3 = in_stack_00000008->num_MPC_parties - 1;
          in_stack_fffffffffffffeb8 = (picnic_instance_t *)(long)(int)uVar3;
          in_stack_fffffffffffffde0 =
               (tree_t *)local_a0[local_110].hashes[(long)in_stack_fffffffffffffeb8];
          getLeaf((tree_t *)((long)local_98 + local_110 * 0x20),uVar3);
          in_R9 = in_stack_00000008;
          commit(in_stack_fffffffffffffea8,(uint8_t *)in_stack_fffffffffffffea0,
                 (uint8_t *)in_stack_fffffffffffffe98,(uint8_t *)in_stack_fffffffffffffe90,
                 (size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffeb8);
        }
        for (local_14a = 0; local_14a < in_stack_00000008->num_rounds; local_14a = local_14a + 1) {
          in_stack_fffffffffffffea8 = local_a8[local_14a];
          xor_byte_array(in_stack_fffffffffffffea8,in_stack_fffffffffffffea8,local_30,
                         (uint)in_stack_00000008->input_output_size);
          for (in_stack_fffffffffffffea0 = (uint16_t *)(ulong)(in_stack_00000008->lowmc).n;
              in_stack_fffffffffffffea0 <
              (uint16_t *)(long)(int)((uint)in_stack_00000008->input_output_size << 3);
              in_stack_fffffffffffffea0 = (uint16_t *)((long)in_stack_fffffffffffffea0 + 1)) {
            setBit(in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0,'\0');
          }
          memset(&stack0xfffffffffffffe80,0,0x20);
          mzd_from_char_array(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                              (size_t)in_stack_fffffffffffffdc8);
          iVar4 = (*p_Var5)((mzd_local_t *)&stack0xfffffffffffffe80,
                            (randomTape_t *)((long)local_90 + (ulong)local_14a * 0x98),
                            local_b0 + local_14a,local_100,(uint8_t *)local_38,in_stack_00000008);
          if (iVar4 != 0) goto LAB_0013e626;
        }
        for (local_190 = (uint16_t *)0x0; missingLeaves_00 = local_190,
            local_190 < (uint16_t *)(long)(int)(in_stack_00000008->num_rounds / 4 << 2);
            local_190 = local_190 + 2) {
          commit_h_x4((uint8_t **)m_maskedKey[0].w64[1],(commitments_t *)m_maskedKey[0].w64[0],
                      in_stack_000000d8);
          commit_v_x4((uint8_t **)last,in_stack_00000110,(msgs_t *)maskedKey,(picnic_instance_t *)i)
          ;
        }
        for (; local_190 < (uint16_t *)(ulong)in_stack_00000008->num_rounds;
            local_190 = (uint16_t *)((long)local_190 + 1)) {
          commit_h((uint8_t *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe88);
          commit_v(in_stack_fffffffffffffea8,(uint8_t *)in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe98,(picnic_instance_t *)in_stack_fffffffffffffe90);
        }
        _Var2 = createTree(in_stack_fffffffffffffdb0,(uint)((ulong)ppVar10 >> 0x20),(uint)ppVar10);
        if (_Var2) {
          buildMerkleTree(in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->nodes,
                          (uint8_t *)in_stack_fffffffffffffdb8,
                          (picnic_instance_t *)in_stack_fffffffffffffdb0);
          list = *(uint16_t **)(local_58 + 6);
          lVar1 = *(long *)&local_58[6].input_output_size;
          ppVar10 = in_stack_00000008;
          HCP(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
              (uint16_t *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
              (uint8_t *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
              (uint8_t *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
              in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffed0,in_stack_fffffffffffffed8)
          ;
          __ptr = getMissingLeavesList((uint16_t *)in_stack_fffffffffffffdc8,ppVar10);
          uVar13 = 0;
          puVar6 = openMerkleTree(in_stack_fffffffffffffde0,missingLeaves_00,
                                  (size_t)in_stack_fffffffffffffdd0,
                                  (size_t *)in_stack_fffffffffffffdc8);
          free(__ptr);
          clearTree((tree_t *)0x13e16e);
          if (puVar6 != (uint8_t *)0x0) {
            *(uint8_t **)(local_58 + 4) = puVar6;
            *(undefined8 *)&local_58[4].input_output_size = uVar13;
            pvVar7 = malloc((long)(int)((uint)in_stack_00000008->num_rounds *
                                       (uint)in_stack_00000008->seed_size));
            *(void **)&local_58[2].input_output_size = pvVar7;
            sVar8 = revealSeeds(in_stack_fffffffffffffde0,missingLeaves_00,
                                (size_t)in_stack_fffffffffffffdd0,
                                (uint8_t *)in_stack_fffffffffffffdc8,(size_t)ppVar10,local_50);
            local_58[3].num_rounds = (short)sVar8;
            local_58[3].digest_size = (char)(sVar8 >> 0x10);
            local_58[3].seed_size = (char)(sVar8 >> 0x18);
            local_58[3].input_output_size = (char)(sVar8 >> 0x20);
            local_58[3].view_size = (char)(sVar8 >> 0x28);
            local_58[3].num_opened_rounds = (char)(sVar8 >> 0x30);
            local_58[3].num_MPC_parties = (char)(sVar8 >> 0x38);
            __size._0_2_ = local_58[3].num_rounds;
            __size._2_1_ = local_58[3].digest_size;
            __size._3_1_ = local_58[3].seed_size;
            __size._4_1_ = local_58[3].input_output_size;
            __size._5_1_ = local_58[3].view_size;
            __size._6_1_ = local_58[3].num_opened_rounds;
            __size._7_1_ = local_58[3].num_MPC_parties;
            pvVar7 = realloc(*(void **)&local_58[2].input_output_size,__size);
            *(void **)&local_58[2].input_output_size = pvVar7;
            lVar12._0_2_ = local_58[7].num_rounds;
            lVar12._2_1_ = local_58[7].digest_size;
            lVar12._3_1_ = local_58[7].seed_size;
            lVar12._4_1_ = local_58[7].input_output_size;
            lVar12._5_1_ = local_58[7].view_size;
            lVar12._6_1_ = local_58[7].num_opened_rounds;
            lVar12._7_1_ = local_58[7].num_MPC_parties;
            params_00 = local_38;
            proof = local_40;
            params_01 = local_50;
            for (uVar11 = 0; uVar11 < in_stack_00000008->num_rounds; uVar11 = uVar11 + 1) {
              iVar4 = contains(list,(ulong)in_stack_00000008->num_opened_rounds,(uint16_t)uVar11);
              if (iVar4 != 0) {
                allocateProof2(proof,params_00);
                iVar4 = indexOf(list,(ulong)in_stack_00000008->num_opened_rounds,(uint16_t)uVar11);
                lVar9 = (long)iVar4;
                *(undefined2 *)(lVar12 + uVar11 * 0x38 + 0x30) = *(undefined2 *)(lVar1 + lVar9 * 2);
                pvVar7 = malloc((long)(int)((uint)in_stack_00000008->num_MPC_parties *
                                           (uint)in_stack_00000008->seed_size));
                *(void **)(lVar12 + uVar11 * 0x38) = pvVar7;
                sVar8 = revealSeeds(in_stack_fffffffffffffde0,missingLeaves_00,
                                    (size_t)in_stack_fffffffffffffdd0,
                                    (uint8_t *)in_stack_fffffffffffffdc8,(size_t)ppVar10,params_01);
                *(size_t *)(lVar12 + uVar11 * 0x38 + 8) = sVar8;
                pvVar7 = realloc(*(void **)(lVar12 + uVar11 * 0x38),
                                 *(size_t *)(lVar12 + uVar11 * 0x38 + 8));
                *(void **)(lVar12 + uVar11 * 0x38) = pvVar7;
                if ((uint)*(ushort *)(lVar1 + lVar9 * 2) != in_stack_00000008->num_MPC_parties - 1)
                {
                  memcpy(*(void **)(lVar12 + uVar11 * 0x38 + 0x10),
                         *(void **)((long)local_90 + uVar11 * 0x98 + 0x80),
                         (ulong)in_stack_00000008->view_size);
                }
                memcpy(*(void **)(lVar12 + uVar11 * 0x38 + 0x20),local_a8[uVar11],
                       (ulong)in_stack_00000008->input_output_size);
                memcpy(*(void **)(lVar12 + uVar11 * 0x38 + 0x28),
                       local_b0[uVar11].msgs[*(ushort *)(lVar1 + lVar9 * 2)],
                       (ulong)in_stack_00000008->view_size);
                if ((uint)*(ushort *)(lVar12 + uVar11 * 0x38 + 0x30) ==
                    in_stack_00000008->num_MPC_parties - 1) {
                  in_stack_fffffffffffffdd0 = *(uint8_t **)(lVar12 + uVar11 * 0x38 + 0x18);
                  getLeaf((tree_t *)((long)local_98 + uVar11 * 0x20),
                          (uint)*(ushort *)(lVar12 + uVar11 * 0x38 + 0x30));
                  params_00 = in_stack_00000008;
                  commit(in_stack_fffffffffffffea8,(uint8_t *)in_stack_fffffffffffffea0,
                         (uint8_t *)in_stack_fffffffffffffe98,(uint8_t *)in_stack_fffffffffffffe90,
                         (size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffeb8);
                }
                else {
                  in_stack_fffffffffffffdc8 = *(tree_t **)(lVar12 + uVar11 * 0x38 + 0x18);
                  getLeaf((tree_t *)((long)local_98 + uVar11 * 0x20),
                          (uint)*(ushort *)(lVar12 + uVar11 * 0x38 + 0x30));
                  params_00 = in_stack_00000008;
                  commit(in_stack_fffffffffffffea8,(uint8_t *)in_stack_fffffffffffffea0,
                         (uint8_t *)in_stack_fffffffffffffe98,(uint8_t *)in_stack_fffffffffffffe90,
                         (size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffeb8);
                }
              }
            }
            local_7c = 0;
          }
        }
LAB_0013e626:
        for (uVar11 = 0; uVar11 < in_stack_00000008->num_rounds; uVar11 = uVar11 + 1) {
          freeRandomTape((randomTape_t *)0x13e65a);
          clearTree((tree_t *)0x13e673);
        }
        freeCommitments2((commitments_t *)0x13e690);
        freeCommitments2((commitments_t *)0x13e69d);
      }
      freeMsgs((msgs_t *)0x13e6aa);
      freeInputs((inputs_t)0x13e6b7);
      freeCommitments((commitments_t *)0x13e6c4);
      free(local_98);
      free(local_90);
    }
    clearTree((tree_t *)0x13e6eb);
    local_24 = local_7c;
  }
  else {
    local_24 = -1;
  }
  return local_24;
}

Assistant:

static int sign_picnic3(const uint8_t* privateKey, const uint8_t* pubKey, const uint8_t* plaintext,
                        const uint8_t* message, size_t messageByteLength, signature2_t* sig,
                        const picnic_instance_t* params) {
  assert(params->num_MPC_parties % 4 == 0);

  tree_t iSeedsTree;
  if (!initialize_seeds_tree(&iSeedsTree, privateKey, pubKey, plaintext, message, messageByteLength,
                             sig, params)) {
    return -1;
  }

  int ret         = -1;
  uint8_t* iSeeds = getLeaves(&iSeedsTree);
  if (!iSeeds) {
    goto free_seedstree;
  }

  randomTape_t* tapes = calloc(params->num_rounds, sizeof(randomTape_t));
  tree_t* seeds       = calloc(params->num_rounds, sizeof(tree_t));
  commitments_t* C    = allocateCommitments(params, 0);

  inputs_t inputs = allocateInputs(params);
  msgs_t* msgs    = allocateMsgs(params);
  if (!tapes || !seeds || !C || !inputs || !msgs) {
    goto free_msgs;
  }

  /* Commitments to the commitments and views */
  commitments_t Ch;
  allocateCommitments2(&Ch, params, params->num_rounds);
  commitments_t Cv;
  allocateCommitments2(&Cv, params, params->num_rounds);

  mzd_local_t m_plaintext[1] = {0};
  mzd_from_char_array(m_plaintext, plaintext, params->input_output_size);

  lowmc_simulate_online_f simulateOnline = lowmc_simulate_online_get_implementation(&params->lowmc);

  for (size_t t = 0; t < params->num_rounds; t++) {
    if (!generateSeeds(&seeds[t], params->num_MPC_parties, &iSeeds[t * params->seed_size],
                       sig->salt, t, params)) {
      goto Exit;
    }
    createRandomTapes(&tapes[t], getLeaves(&seeds[t]), sig->salt, t, params);
    /* Preprocessing; compute aux tape for the N-th player, for each parallel rep */
    computeAuxTape(&tapes[t], inputs[t], params);
    /* Commit to seeds and aux bits */
    for (size_t j = 0; j < params->num_MPC_parties; j += 4) {
      const uint8_t* seed_ptr[4] = {getLeaf(&seeds[t], j + 0), getLeaf(&seeds[t], j + 1),
                                    getLeaf(&seeds[t], j + 2), getLeaf(&seeds[t], j + 3)};
      commit_x4(C[t].hashes + j, seed_ptr, sig->salt, t, j, params);
    }
    const size_t last = params->num_MPC_parties - 1;
    commit(C[t].hashes[last], getLeaf(&seeds[t], last), tapes[t].aux_bits, sig->salt, t, last,
           params);
  }

  for (uint16_t t = 0; t < params->num_rounds; t++) {
    /* Simulate the online phase of the MPC */
    uint8_t* maskedKey = inputs[t];

    xor_byte_array(maskedKey, maskedKey, privateKey,
                   params->input_output_size); // maskedKey += privateKey
    for (size_t i = params->lowmc.n; i < params->input_output_size * 8; i++) {
      setBit(maskedKey, i, 0);
    }
    mzd_local_t m_maskedKey[1] = {0};
    mzd_from_char_array(m_maskedKey, maskedKey, params->input_output_size);

    int rv = simulateOnline(m_maskedKey, &tapes[t], &msgs[t], m_plaintext, pubKey, params);
    picnic_declassify(&rv, sizeof(rv));
    if (rv != 0) {
#if !defined(NDEBUG)
      printf("MPC simulation failed in round %" PRIu16 ", aborting signature\n", t);
#endif
      goto Exit;
    }
  }

  /* Commit to the commitments and views */
  {
    size_t t = 0;
    for (; t < params->num_rounds / 4 * 4; t += 4) {
      commit_h_x4(&Ch.hashes[t], &C[t], params);
      commit_v_x4(&Cv.hashes[t], (const uint8_t**)&inputs[t], &msgs[t], params);
    }
    for (; t < params->num_rounds; t++) {
      commit_h(Ch.hashes[t], &C[t], params);
      commit_v(Cv.hashes[t], inputs[t], &msgs[t], params);
    }
  }
  /* Create a Merkle tree with Cv as the leaves */
  tree_t treeCv;
  if (!createTree(&treeCv, params->num_rounds, params->digest_size)) {
    goto Exit;
  }
  buildMerkleTree(&treeCv, Cv.hashes, sig->salt, params);

  /* Compute the challenge; two lists of integers */
  uint16_t* challengeC = sig->challengeC;
  uint16_t* challengeP = sig->challengeP;
  HCP(sig->challenge, challengeC, challengeP, &Ch, treeCv.nodes, sig->salt, pubKey, plaintext,
      message, messageByteLength, params);

  /* Send information required for checking commitments with Merkle tree.
   * The commitments the verifier will be missing are those not in challengeC. */
  size_t missingLeavesSize = params->num_rounds - params->num_opened_rounds;
  uint16_t* missingLeaves  = getMissingLeavesList(challengeC, params);
  size_t cvInfoLen         = 0;
  uint8_t* cvInfo          = openMerkleTree(&treeCv, missingLeaves, missingLeavesSize, &cvInfoLen);
  free(missingLeaves);
  clearTree(&treeCv);

  if (!cvInfo) {
    goto Exit;
  }
  sig->cvInfo    = cvInfo;
  sig->cvInfoLen = cvInfoLen;

  /* Reveal iSeeds for unopened rounds, those in {0..T-1} \ ChallengeC. */
  sig->iSeedInfo    = malloc(params->num_rounds * params->seed_size);
  sig->iSeedInfoLen = revealSeeds(&iSeedsTree, challengeC, params->num_opened_rounds,
                                  sig->iSeedInfo, params->num_rounds * params->seed_size, params);
  sig->iSeedInfo    = realloc(sig->iSeedInfo, sig->iSeedInfoLen);

  /* Assemble the proof */
  proof2_t* proofs = sig->proofs;
  for (size_t t = 0; t < params->num_rounds; t++) {
    if (contains(challengeC, params->num_opened_rounds, t)) {
      allocateProof2(&proofs[t], params);
      size_t P_index          = indexOf(challengeC, params->num_opened_rounds, t);
      proofs[t].unOpenedIndex = challengeP[P_index];

      uint16_t hideList[1];
      hideList[0]           = challengeP[P_index];
      proofs[t].seedInfo    = malloc(params->num_MPC_parties * params->seed_size);
      proofs[t].seedInfoLen = revealSeeds(&seeds[t], hideList, 1, proofs[t].seedInfo,
                                          params->num_MPC_parties * params->seed_size, params);
      proofs[t].seedInfo    = realloc(proofs[t].seedInfo, proofs[t].seedInfoLen);

      size_t last = params->num_MPC_parties - 1;
      if (challengeP[P_index] != last) {
        memcpy(proofs[t].aux, tapes[t].aux_bits, params->view_size);
      }

      memcpy(proofs[t].input, inputs[t], params->input_output_size);
      memcpy(proofs[t].msgs, msgs[t].msgs[challengeP[P_index]], params->view_size);

      /* recompute commitment of unopened party since we did not store it for memory optimization
       */
      if (proofs[t].unOpenedIndex == params->num_MPC_parties - 1) {
        commit(proofs[t].C, getLeaf(&seeds[t], proofs[t].unOpenedIndex), tapes[t].aux_bits,
               sig->salt, t, proofs[t].unOpenedIndex, params);
      } else {
        commit(proofs[t].C, getLeaf(&seeds[t], proofs[t].unOpenedIndex), NULL, sig->salt, t,
               proofs[t].unOpenedIndex, params);
      }
    }
  }
  ret = 0;

Exit:
  for (size_t t = 0; t < params->num_rounds; t++) {
    freeRandomTape(&tapes[t]);
    clearTree(&seeds[t]);
  }
  freeCommitments2(&Cv);
  freeCommitments2(&Ch);

free_msgs:
  freeMsgs(msgs);
  freeInputs(inputs);
  freeCommitments(C);
  free(seeds);
  free(tapes);

free_seedstree:
  clearTree(&iSeedsTree);

  return ret;
}